

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

int __thiscall Fl_Check_Browser::item_width(Fl_Check_Browser *this,void *v)

{
  Fl_Font face;
  Fl_Fontsize FVar1;
  double dVar2;
  void *v_local;
  Fl_Check_Browser *this_local;
  
  face = Fl_Browser_::textfont(&this->super_Fl_Browser_);
  FVar1 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  fl_font(face,FVar1);
  dVar2 = fl_width(*(char **)((long)v + 0x18));
  FVar1 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
  return (int)dVar2 + FVar1 + 6;
}

Assistant:

int Fl_Check_Browser::item_width(void *v) const {
	fl_font(textfont(), textsize());
	return int(fl_width(((cb_item *)v)->text)) + CHECK_SIZE + 8;
}